

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alarm.cpp
# Opt level: O2

void __thiscall Alarm::Alarm(Alarm *this,uint64_t millis,function<void_()> *callback)

{
  uint64_t uVar1;
  Error *this_00;
  
  std::function<void_()>::function(&this->callback,callback);
  if (millis != 0) {
    uVar1 = current_time_millis();
    this->millis = uVar1 + millis;
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x3f0);
  Error::Error(this_00,"Illegal millis value");
  __cxa_throw(this_00,&Error::typeinfo,std::exception::~exception);
}

Assistant:

Alarm::Alarm(uint64_t millis, std::function<void()> callback) : callback(std::move(callback)) {
  if (millis <= 0) {
    throw Error("Illegal millis value");
  }
  uint64_t now = current_time_millis();
  this->millis = now + millis;
}